

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.h
# Opt level: O3

void __thiscall flagser_parameters::~flagser_parameters(flagser_parameters *this)

{
  filtration_algorithm_t *pfVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  pfVar1 = (this->filtration_algorithm)._M_t.
           super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>
           .super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl;
  if (pfVar1 != (filtration_algorithm_t *)0x0) {
    (*pfVar1->_vptr_filtration_algorithm_t[1])();
  }
  (this->filtration_algorithm)._M_t.
  super___uniq_ptr_impl<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>._M_t.
  super__Tuple_impl<0UL,_filtration_algorithm_t_*,_std::default_delete<filtration_algorithm_t>_>.
  super__Head_base<0UL,_filtration_algorithm_t_*,_false>._M_head_impl =
       (filtration_algorithm_t *)0x0;
  pcVar2 = (this->hdf5_type)._M_dataplus._M_p;
  paVar3 = &(this->hdf5_type).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->cache)._M_dataplus._M_p;
  paVar3 = &(this->cache).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->output_format)._M_dataplus._M_p;
  paVar3 = &(this->output_format).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->output_name)._M_dataplus._M_p;
  paVar3 = &(this->output_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->input_format)._M_dataplus._M_p;
  paVar3 = &(this->input_format).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

flagser_parameters() { filtration_algorithm.reset(get_filtration_computer("zero")); }